

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O0

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Count<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
::TestBody(Count<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
           *this)

{
  bool bVar1;
  back_insert_iterator<std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
  bVar2;
  iterator first;
  iterator last;
  Message *pMVar3;
  char *pcVar4;
  AssertHelper local_838;
  string local_830;
  Message local_810;
  size_t local_808;
  int local_7fc;
  undefined1 local_7f8 [8];
  AssertionResult gtest_ar_1;
  pair<const_int,_int> *p_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2_1;
  AssertHelper local_7b8;
  string local_7b0;
  Message local_790;
  size_t local_788;
  int local_77c;
  undefined1 local_778 [8];
  AssertionResult gtest_ar;
  pair<const_int,_int> *p;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *__range2;
  TypeParam m;
  undefined1 local_28 [8];
  vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> values;
  Count<phmap::parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>_>
  *this_local;
  
  values.super__Vector_base<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::vector
            ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28);
  bVar2 = std::
          back_inserter<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>
                    ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_28);
  m.
  super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .
  super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .sets_._M_elems[0xf].set_.settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
       (unsigned_long)
       std::
       generate_n<std::back_insert_iterator<std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<int_const,int>,void>>
                 (bVar2.container,10);
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  ::parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
              *)&__range2);
  __end0 = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::
           begin((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_28);
  p = (pair<const_int,_int> *)
      std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                                     *)&p), bVar1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
           ::operator*(&__end0);
    local_77c = 0;
    local_788 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                              *)&__range2,
                             (key_arg<int> *)
                             gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_778,"0","m.count(p.first)",&local_77c,&local_788);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_778);
    if (!bVar1) {
      testing::Message::Message(&local_790);
      testing::PrintToString<int>
                (&local_7b0,
                 (int *)gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
      pMVar3 = testing::Message::operator<<(&local_790,&local_7b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_778);
      testing::internal::AssertHelper::AssertHelper
                (&local_7b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x4a,pcVar4);
      testing::internal::AssertHelper::operator=(&local_7b8,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_7b8);
      std::__cxx11::string::~string((string *)&local_7b0);
      testing::Message::~Message(&local_790);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_778);
    __gnu_cxx::
    __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::operator++(&__end0);
  }
  first = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                    ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                      *)local_28);
  last = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>
                     *)local_28);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<int_const,int>*,std::vector<std::pair<int_const,int>,std::allocator<std::pair<int_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,std::mutex,phmap::priv::FlatHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
              *)&__range2,
             (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              )first._M_current,
             (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
              )last._M_current);
  __end0_1 = std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::
             begin((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *
                   )local_28);
  p_1 = (pair<const_int,_int> *)
        std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                  ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *
                   )local_28);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0_1,
                            (__normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
                             *)&p_1), bVar1) {
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
           ::operator*(&__end0_1);
    local_7fc = 1;
    local_808 = parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                ::count<int>((parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_std::mutex,_phmap::priv::FlatHashMapPolicy<int,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>_>
                              *)&__range2,
                             (key_arg<int> *)
                             gtest_ar_1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_7f8,"1","m.count(p.first)",&local_7fc,&local_808);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
    if (!bVar1) {
      testing::Message::Message(&local_810);
      testing::PrintToString<int>
                (&local_830,
                 (int *)gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl);
      pMVar3 = testing::Message::operator<<(&local_810,&local_830);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_7f8);
      testing::internal::AssertHelper::AssertHelper
                (&local_838,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                 ,0x4d,pcVar4);
      testing::internal::AssertHelper::operator=(&local_838,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_838);
      std::__cxx11::string::~string((string *)&local_830);
      testing::Message::~Message(&local_810);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
    __gnu_cxx::
    __normal_iterator<std::pair<const_int,_int>_*,_std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>_>
    ::operator++(&__end0_1);
  }
  parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
  ::~parallel_flat_hash_map
            ((parallel_flat_hash_map<int,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_int>_>,_4UL,_std::mutex>
              *)&__range2);
  std::vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_>::~vector
            ((vector<std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             local_28);
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, Count) {
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values)
    EXPECT_EQ(0, m.count(p.first)) << ::testing::PrintToString(p.first);
  m.insert(values.begin(), values.end());
  for (const auto& p : values)
    EXPECT_EQ(1, m.count(p.first)) << ::testing::PrintToString(p.first);
}